

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_LD(void)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  word wVar7;
  Z80Reg ZVar8;
  EBracketType EVar9;
  Z80Reg ZVar10;
  int iVar11;
  Z80Reg r16;
  uint uVar12;
  Z80Reg ZVar13;
  Z80Reg ZVar14;
  ulong uVar15;
  Z80Reg *pZVar16;
  undefined1 uVar17;
  EType minType;
  undefined8 in_RSI;
  aint aVar18;
  char **in_RDI;
  char **ppcVar19;
  aint b;
  int e [11];
  uint local_70;
  Z80Reg local_6c;
  Z80Reg local_68;
  undefined8 uStack_64;
  uint uStack_5c;
  Z80Reg local_58;
  undefined8 local_54;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  
  do {
    uVar17 = (undefined1)in_RSI;
    uStack_48 = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    local_58 = Z80_UNK;
    local_54 = 0xffffffffffffffff;
    local_4c = 0xffffffff;
    local_68 = Z80_UNK;
    uStack_64 = 0xffffffffffffffff;
    uStack_5c = 0xffffffff;
    bVar2 = true;
    ZVar8 = GetRegister(in_RDI);
    ZVar10 = ZVar8;
    if (ZVar8 < Z80_SP) {
      uVar15 = (ulong)(uint)(ZVar8 + Z80_C);
      if ((uint)(ZVar8 + Z80_C) < 0x34) {
        ZVar14 = Z80_B;
        if ((0x80008000007feU >> (uVar15 & 0x3f) & 1) == 0) {
          if ((0x2000200020000U >> (uVar15 & 0x3f) & 1) != 0) {
LAB_00136d5c:
            bVar2 = false;
            ZVar14 = Z80_B;
            goto LAB_00136da9;
          }
          if (uVar15 != 0) goto switchD_00136df7_caseD_a;
          ppcVar19 = &lp;
          EVar9 = OpenBracket(&lp);
          if (EVar9 == BT_NONE) goto switchD_00136df7_caseD_a;
          ZVar10 = GetRegister(ppcVar19);
          if (ZVar10 == Z80_UNK) {
            wVar7 = GetWord(ppcVar19);
            local_70 = (uint)wVar7;
          }
          iVar11 = CloseBracket(&lp);
          if (iVar11 == 0) goto switchD_00136df7_caseD_a;
          ppcVar19 = &lp;
          bVar2 = comma(&lp);
          if (!bVar2) goto switchD_00136df7_caseD_a;
          ZVar8 = GetRegister(ppcVar19);
          if ((Z80_I|Z80_A) < ZVar10) {
            if (((ZVar10 == Z80_BC) || (ZVar10 == Z80_DE)) && (ZVar8 == Z80_A)) {
              local_68 = ZVar10 + ~(Z80_I|Z80_L);
            }
            goto switchD_00136df7_caseD_a;
          }
          if (ZVar10 != Z80_UNK) {
            if (((ZVar10 == Z80_C) && (ZVar8 == Z80_A)) && (Options::IsLR35902 != '\0')) {
              local_68 = 0xe2;
            }
            goto switchD_00136df7_caseD_a;
          }
          if (Options::IsLR35902 == '\x01') {
            uStack_64 = CONCAT44(uStack_64._4_4_,local_70) & 0xffffffff000000ff;
            ZVar10 = 0xe0;
            if ((local_70 & 0xffffff00) != 0xff00 || ZVar8 != Z80_A) {
              uStack_64 = CONCAT44(local_70 >> 8,(Z80Reg)uStack_64) & 0xffffffffff;
              ZVar10 = 0xea;
              if (ZVar8 == Z80_SP) {
                ZVar10 = Z80_I;
              }
              else if (ZVar8 != Z80_A) goto switchD_00136df7_caseD_a;
            }
            local_68 = ZVar10;
            goto switchD_00136df7_caseD_a;
          }
          uVar12 = ZVar8 + ~Z80_MEM_HL;
          if (uVar12 < 0x3a) {
            if ((0x200000002000200U >> ((ulong)uVar12 & 0x3f) & 1) != 0) {
              if (Options::IsI8080 != '\0') goto switchD_00136df7_caseD_a;
              local_68 = 0xed;
              iVar11 = ZVar8 + (LR35902_MEM_HL_D|Z80_C);
              goto LAB_00137947;
            }
            if ((0x20000000001U >> ((ulong)uVar12 & 0x3f) & 1) == 0) goto LAB_00137929;
            local_68 = (uint)(ZVar8 == Z80_A) << 4 | LR35902_MEM_HL_I;
LAB_0013764e:
            uStack_64 = CONCAT44(local_70 >> 8,local_70) & 0xffffffff000000ff;
            aVar18 = 1;
          }
          else {
LAB_00137929:
            if ((ZVar8 != Z80_IX) && (ZVar8 != Z80_IY)) goto switchD_00136df7_caseD_a;
            iVar11 = 0x22;
            local_68 = ZVar8;
LAB_00137947:
            uStack_64 = CONCAT44(local_70,iVar11);
            uStack_5c = local_70 >> 8 & 0xff;
            aVar18 = 2;
          }
          uStack_64 = uStack_64 & 0xffffffffff;
          minType = REGULAR;
LAB_00137238:
          resolveRelocationAndSmartSmc(aVar18,minType);
        }
        else {
LAB_00136da9:
          ppcVar19 = &lp;
          bVar3 = comma(&lp);
          pcVar1 = lp;
          lp = pcVar1;
          if (!bVar3) goto switchD_00136df7_caseD_a;
          local_6c = Z80_B;
          r16 = GetRegister(ppcVar19);
          if (r16 < Z80_HL) {
            ZVar13 = r16;
            switch(r16) {
            case Z80_B:
            case Z80_C:
            case Z80_D:
            case Z80_E:
            case Z80_H:
            case Z80_L:
            case Z80_A:
switchD_00136df7_caseD_0:
              if (bVar2) {
                if ((ZVar10 & ~Z80_BC) != LR35902_MEM_HL_I) goto switchD_00136df7_caseD_b;
                if (r16 == Z80_A) {
                  local_68 = ZVar10;
                }
              }
              break;
            case Z80_MEM_HL:
switchD_00136df7_caseD_6:
              if (ZVar14 == Z80_B && ZVar10 != Z80_MEM_HL) {
                if (((ZVar10 != Z80_BC) && (ZVar10 != Z80_DE)) &&
                   (r16 = Z80_MEM_HL, ZVar10 != Z80_HL || local_6c == Z80_B))
                goto switchD_00136df7_caseD_0;
                goto switchD_00136df7_caseD_ffffffff;
              }
              break;
            case Z80_I:
            case Z80_R:
              if (ZVar10 == Z80_A) {
                local_68 = 0xed;
                uVar12 = (uint)(r16 != Z80_I) * 8 + 0x57;
LAB_00136f9c:
                uStack_64 = CONCAT44(uStack_64._4_4_,uVar12);
              }
              break;
            case Z80_F:
              break;
            default:
switchD_00136df7_caseD_b:
              if ((ZVar10 & ~Z80_C) == Z80_I) {
                if (r16 == Z80_A) {
                  local_68 = 0xed;
                  uVar12 = (uint)(ZVar10 != Z80_I) * 8 + 0x47;
                  goto LAB_00136f9c;
                }
              }
              else if (ZVar10 == Z80_SP) {
                if (r16 == Z80_HL) {
                  pZVar16 = &local_68;
                  if (local_6c != Z80_B) {
                    local_68 = local_6c;
                    pZVar16 = (Z80Reg *)&uStack_64;
                  }
                  goto LAB_00136f6f;
                }
              }
              else if (bVar2) {
                if (((r16 & ~Z80_C) != Z80_H || (ZVar10 & ~Z80_C) != Z80_H) || ZVar14 == local_6c) {
                  pZVar16 = &local_68;
                  if ((local_6c | ZVar14) != Z80_B) {
                    if (ZVar10 == Z80_MEM_HL || r16 == Z80_MEM_HL) {
                      uStack_64 = CONCAT44(GetRegister_lastIxyD,(Z80Reg)uStack_64);
                    }
                    pZVar16 = (Z80Reg *)&uStack_64;
                    local_68 = local_6c | ZVar14;
                  }
                  *pZVar16 = r16 + Z80_SP + ZVar10 * 8;
                }
              }
              else {
LAB_0013729b:
                bVar2 = Options::noFakes(true);
                if (!bVar2) {
                  if ((ZVar10 == r16) && (ZVar14 != local_6c)) {
                    pZVar16 = &local_68;
                    if (local_6c != Z80_B) {
                      local_68 = local_6c;
                      pZVar16 = (Z80Reg *)&uStack_64;
                    }
                    pZVar16[0] = 0xe5;
                    pZVar16[1] = ~Z80_C;
                    if (ZVar14 == Z80_B) {
                      pZVar16 = pZVar16 + 2;
                    }
                    else {
                      pZVar16[2] = ZVar14;
                      pZVar16 = pZVar16 + 3;
                    }
                    *pZVar16 = 0xe1;
                  }
                  else {
                    if (local_6c != Z80_B) {
                      ZVar14 = local_6c;
                    }
                    pZVar16 = &local_68;
                    if (ZVar14 != Z80_B) {
                      pZVar16 = (Z80Reg *)&uStack_64;
                      local_68 = ZVar14;
                    }
                    ZVar8 = GetRegister_r16High(r16);
                    ZVar13 = GetRegister_r16High(ZVar10);
                    *pZVar16 = ZVar8 + Z80_SP + ZVar13 * 8;
                    pZVar16[1] = ~Z80_C;
                    if (ZVar14 == Z80_B) {
                      pZVar16 = pZVar16 + 2;
                    }
                    else {
                      pZVar16[2] = ZVar14;
                      pZVar16 = pZVar16 + 3;
                    }
                    ZVar8 = GetRegister_r16Low(r16);
                    ZVar10 = GetRegister_r16Low(ZVar10);
                    *pZVar16 = ZVar8 + Z80_SP + ZVar10 * 8;
                  }
                }
              }
              break;
            case Z80_BC:
            case Z80_DE:
switchD_00136df7_caseD_10:
              r16 = ZVar13;
              if (!bVar2) goto switchD_00136df7_caseD_b;
              if (ZVar10 == Z80_MEM_HL) goto switchD_00136df7_caseD_ffffffff;
              break;
            case LR35902_MEM_HL_I:
switchD_00136df7_caseD_22:
              if (ZVar10 == Z80_A) {
                local_68 = r16 + Z80_I;
              }
              break;
            case Z80_UNK:
switchD_00136df7_caseD_ffffffff:
              if ((Z80_BC|Z80_I|Z80_A) < ZVar8) {
                if (ZVar8 < Z80_IXH) {
                  if (((uint)(ZVar8 + ~(Z80_BC|Z80_I|Z80_A)) < 0x21) &&
                     ((0x100010001U >> ((ulong)(uint)(ZVar8 + ~(Z80_BC|Z80_I|Z80_A)) & 0x3f) & 1) !=
                      0)) goto switchD_001370f0_caseD_10;
                  if (((ZVar8 == Z80_IX) || (lp = pcVar1, ZVar8 == Z80_IY)) &&
                     (lp = pcVar1, iVar11 = ParseExpressionMemAccess(&lp,(aint *)&local_70),
                     0 < iVar11)) {
                    uStack_64 = CONCAT44(uStack_64._4_4_,(uint)(iVar11 != 1) * 9 + 0x21);
                    local_68 = ZVar8;
                    check16(local_70);
                    uStack_64 = CONCAT44(local_70,(Z80Reg)uStack_64) & 0xffffffffff;
                    uStack_5c = local_70 >> 8 & 0xff;
                    resolveRelocationAndSmartSmc(2,REGULAR);
                    if ((iVar11 == 2) && (lp[-1] == ')')) {
                      uVar17 = uStack_64._4_1_;
                      bVar4 = (byte)uStack_5c;
LAB_00137395:
                      checkLowMemory(bVar4,uVar17);
                    }
                  }
                  break;
                }
                if (ZVar8 < Z80_IYL) {
                  if (((ZVar8 != Z80_IXH) && (ZVar8 != Z80_IYH)) && (lp = pcVar1, ZVar8 != Z80_IXL))
                  break;
LAB_0013720a:
                  local_68 = ZVar8 & 0xff;
                  uStack_64 = CONCAT44(uStack_64._4_4_,((uint)ZVar8 >> 8) * 8 + 6);
                  lp = pcVar1;
                  bVar4 = GetByteNoMem((char **)0x0,(bool)uVar17);
                  uStack_64 = (ulong)CONCAT14(bVar4,(Z80Reg)uStack_64);
                  aVar18 = 2;
                }
                else {
                  if (ZVar8 == Z80_IYL) goto LAB_0013720a;
                  if ((ZVar8 != Z80_MEM_IX) && (lp = pcVar1, ZVar8 != Z80_MEM_IY)) break;
                  uStack_64 = CONCAT44(GetRegister_lastIxyD,(Z80Reg)uStack_64);
                  lp = pcVar1;
                  ZVar10 = GetRegister(ppcVar19);
                  if ((Z80_BC|Z80_I|Z80_A) < ZVar10) {
                    if ((ZVar10 == Z80_HL) || (ZVar10 == Z80_DE)) {
LAB_00137557:
                      bVar2 = Options::noFakes(true);
                      if (!bVar2) {
                        if (uStack_64._4_4_ == 0x7f) {
                          Error("Offset out of range",(char *)0x0,IF_FIRST);
                          iVar11 = uStack_64._4_4_;
                        }
                        else {
                          local_68 = ZVar8 & 0xff;
                          iVar11 = uStack_64._4_4_;
                        }
                        ZVar14 = GetRegister_r16Low(ZVar10);
                        uStack_64 = CONCAT44(uStack_64._4_4_,ZVar14 + (Z80_SP|Z80_HL));
                        uStack_5c = 0xfffffffe;
                        local_58 = ZVar8 & 0xff;
                        ZVar10 = GetRegister_r16High(ZVar10);
                        local_54 = CONCAT44(iVar11 + 1,ZVar10 + (Z80_SP|Z80_HL));
                      }
                    }
                    break;
                  }
                  if (ZVar10 != Z80_UNK) {
                    if (ZVar10 == Z80_BC) goto LAB_00137557;
                    break;
                  }
                  local_68 = ZVar8 & 0xff;
                  uStack_64 = CONCAT44(uStack_64._4_4_,0x36);
                  bVar6 = GetByteNoMem((char **)0x0,(bool)uVar17);
                  uStack_5c = (uint)bVar6;
                  aVar18 = 3;
                }
LAB_00137233:
                minType = HIGH;
                goto LAB_00137238;
              }
              lp = pcVar1;
              switch(ZVar8) {
              case Z80_B:
              case Z80_C:
              case Z80_D:
              case Z80_E:
              case Z80_H:
              case Z80_L:
                local_68 = ZVar8 * 8 + Z80_MEM_HL;
LAB_001370fd:
                bVar6 = GetByteNoMem((char **)0x0,(bool)uVar17);
LAB_00137107:
                uStack_64 = CONCAT44(uStack_64._4_4_,(uint)bVar6);
                aVar18 = 1;
                goto LAB_00137233;
              case Z80_MEM_HL:
                ZVar10 = GetRegister(ppcVar19);
                if (ZVar10 == Z80_UNK) {
                  local_68 = Z80_HL|Z80_MEM_HL;
                  goto LAB_001370fd;
                }
                if (((ZVar10 == Z80_DE) || (ZVar10 == Z80_BC)) &&
                   (bVar2 = Options::noFakes(true), !bVar2)) {
                  local_68 = GetRegister_r16Low(ZVar10);
                  local_68 = local_68 + (Z80_SP|Z80_HL);
                  uStack_64 = 0x23fffffffe;
                  uStack_5c = 0xfffffffe;
                  local_58 = GetRegister_r16High(ZVar10);
                  local_58 = local_58 + (Z80_SP|Z80_HL);
LAB_00137533:
                  local_54 = 0x2bfffffffe;
                }
                break;
              case Z80_A:
                ppcVar19 = &lp;
                EVar9 = OpenBracket(&lp);
                if (EVar9 == BT_NONE) {
LAB_00137842:
                  iVar11 = ParseExpressionMemAccess(&lp,(aint *)&local_70);
                  if (iVar11 == 2) {
                    check16(local_70);
                    if (Options::IsLR35902 == '\x01') {
                      if ((local_70 & 0xffffff00) != 0xff00) {
                        local_68 = 0xfa;
                        goto LAB_0013764e;
                      }
                      local_68 = 0xf0;
                      uStack_64 = CONCAT44(uStack_64._4_4_,local_70) & 0xffffffff000000ff;
                    }
                    else {
                      local_68 = Z80_HL|Z80_F;
                      uStack_64 = CONCAT44(local_70 >> 8,local_70) & 0xff000000ff;
                      resolveRelocationAndSmartSmc(1,REGULAR);
                      if (EVar9 == BT_ROUND) {
                        uVar17 = (undefined1)uStack_64;
                        bVar4 = uStack_64._4_1_;
                        goto LAB_00137395;
                      }
                    }
                    break;
                  }
                  if (iVar11 != 1) break;
                  check8(local_70);
                  local_68 = Z80_HL|Z80_I|Z80_MEM_HL;
                  bVar6 = (byte)local_70;
                  goto LAB_00137107;
                }
                ZVar10 = GetRegister(ppcVar19);
                if (ZVar10 < Z80_BC) {
                  if (ZVar10 == Z80_UNK) {
                    lp = lp + -1;
                    goto LAB_00137842;
                  }
                  if (((ZVar10 == Z80_C) && (Options::IsLR35902 == '\x01')) &&
                     (iVar11 = CloseBracket(&lp), iVar11 != 0)) {
                    local_68 = 0xf2;
                  }
                }
                else if (((ZVar10 == Z80_DE) || (ZVar10 == Z80_BC)) &&
                        (iVar11 = CloseBracket(&lp), iVar11 != 0)) {
                  local_68 = ZVar10 + ~Z80_L;
                }
                break;
              case Z80_BC:
switchD_001370f0_caseD_10:
                lp = pcVar1;
                ZVar10 = GetRegister(ppcVar19);
                if (ZVar10 < Z80_SP) {
                  if (ZVar10 == Z80_UNK) {
                    iVar11 = ParseExpressionMemAccess(&lp,(aint *)&local_70);
                    if (iVar11 == 2) {
                      if (Options::IsLR35902 == '\0') {
                        check16(local_70);
                        if (ZVar8 == Z80_HL) {
                          local_68 = Z80_DE|Z80_F;
                          uStack_64 = CONCAT44(local_70 >> 8,local_70) & 0xffffffff000000ff;
                          aVar18 = 1;
                        }
                        else {
                          if (Options::IsI8080 != '\0') break;
                          local_68 = 0xed;
                          uStack_64 = CONCAT44(local_70,ZVar8 + (Z80_HL|Z80_F|Z80_C));
                          uStack_5c = local_70 >> 8 & 0xff;
                          aVar18 = 2;
                        }
                        uStack_64 = uStack_64 & 0xffffffffff;
                        resolveRelocationAndSmartSmc(aVar18,REGULAR);
                        if (lp[-1] == ')') {
                          uVar17 = (char)local_70;
                          bVar4 = (byte)(local_70 >> 8);
                          goto LAB_00137395;
                        }
                      }
                    }
                    else if (iVar11 == 1) {
                      check16(local_70);
                      local_68 = ZVar8 + ~(Z80_I|Z80_MEM_HL);
                      goto LAB_0013764e;
                    }
                  }
                  else if ((ZVar10 == Z80_MEM_HL) && (bVar2 = Options::noFakes(true), !bVar2)) {
                    local_68 = ZVar8 + (Z80_HL|Z80_I|Z80_MEM_HL);
                    uStack_64 = 0x23fffffffe;
                    uStack_5c = 0xfffffffe;
                    local_58 = ZVar8 + (Z80_HL|Z80_MEM_HL);
                    goto LAB_00137533;
                  }
                }
                else if (ZVar10 == Z80_SP) {
                  if ((ZVar8 == Z80_HL) && (Options::IsLR35902 != '\0')) {
                    local_70 = 0;
                    iVar11 = SkipBlanks(&lp);
                    if (iVar11 == 0) {
                      cVar5 = *lp;
                      if (cVar5 != '+') {
                        if (cVar5 == ',') goto LAB_001375f4;
                        if (cVar5 != '-') {
                          Error("[LD] `ld hl,sp+r8` expects + or - after sp, found",lp,PASS3);
                          break;
                        }
                      }
                      bVar6 = GetByteNoMem((char **)0x1,SUB81(lp,0));
                      local_70 = (uint)bVar6;
                    }
LAB_001375f4:
                    local_68 = 0xf8;
                    uVar12 = local_70;
                    goto LAB_00136f9c;
                  }
                }
                else if ((((ZVar10 == Z80_MEM_IX) || (ZVar10 == Z80_MEM_IY)) && (ZVar8 != Z80_SP))
                        && (bVar2 = Options::noFakes(true), !bVar2)) {
                  uStack_64 = CONCAT44(GetRegister_lastIxyD,ZVar8 + (Z80_HL|Z80_I|Z80_MEM_HL));
                  local_54 = CONCAT44(GetRegister_lastIxyD + 1,ZVar8 + (Z80_HL|Z80_MEM_HL));
                  if (GetRegister_lastIxyD == 0x7f) {
                    Error("Offset out of range",(char *)0x0,IF_FIRST);
                  }
                  else {
                    local_68 = ZVar10 & 0xff;
                    local_58 = local_68;
                  }
                  uStack_5c = 0xfffffffe;
                }
              }
            }
          }
          else {
            if (0x4dc < r16) {
              if (r16 < Z80_IYL) {
                if (((r16 == Z80_IXH) || (r16 == Z80_IYH)) || (r16 == Z80_IXL)) {
LAB_00136ef5:
                  if ((bool)(bVar2 ^ 1U | ZVar10 == Z80_MEM_HL)) goto switchD_00136df7_caseD_a;
                  local_6c = r16 & 0xff;
                  r16 = (uint)r16 >> 8;
                }
              }
              else {
                if ((r16 == Z80_MEM_IY) || (r16 == Z80_MEM_IX)) {
                  local_6c = r16 & 0xff;
                  goto switchD_00136df7_caseD_6;
                }
                if (r16 == Z80_IYL) goto LAB_00136ef5;
              }
              goto switchD_00136df7_caseD_b;
            }
            if ((Z80_SP|Z80_I|Z80_A) < r16) {
              if (r16 != Z80_AF) {
                if ((r16 == Z80_IX) || (r16 == Z80_IY)) {
                  ZVar13 = Z80_HL;
                  local_6c = r16;
                  goto switchD_00136df7_caseD_10;
                }
                goto switchD_00136df7_caseD_b;
              }
              goto switchD_00136df7_caseD_a;
            }
            if (r16 != Z80_HL) {
              if (r16 == LR35902_MEM_HL_D) goto switchD_00136df7_caseD_22;
              if (r16 != Z80_SP) goto switchD_00136df7_caseD_b;
LAB_00136e52:
              if ((ZVar10 == Z80_HL) && (Options::IsLR35902 != '\0'))
              goto switchD_00136df7_caseD_ffffffff;
              goto switchD_00136df7_caseD_a;
            }
            if (ZVar10 == Z80_MEM_HL && ZVar14 != Z80_B) goto switchD_00136df7_caseD_ffffffff;
            if (bVar2) goto LAB_00136e52;
            if ((ZVar10 & ~Z80_C) == Z80_I) goto switchD_00136df7_caseD_a;
            pZVar16 = &local_68;
            if (ZVar10 != Z80_SP) {
              local_6c = Z80_B;
              r16 = Z80_HL;
              goto LAB_0013729b;
            }
LAB_00136f6f:
            *pZVar16 = 0xf9;
          }
        }
      }
    }
    else if (ZVar8 < Z80_IYH) {
      if (ZVar8 < Z80_IY) {
        if (ZVar8 == Z80_SP) goto LAB_00136d5c;
        if (ZVar8 == Z80_IX) goto LAB_00136d9d;
      }
      else {
        if (ZVar8 == Z80_IY) {
LAB_00136d9d:
          ZVar10 = Z80_HL;
          bVar2 = false;
          ZVar14 = ZVar8;
          goto LAB_00136da9;
        }
        if (ZVar8 == Z80_IXH) goto LAB_00136d90;
      }
    }
    else if (ZVar8 < Z80_IYL) {
      if ((ZVar8 == Z80_IYH) || (ZVar8 == Z80_IXL)) goto LAB_00136d90;
    }
    else if ((ZVar8 == Z80_IYL) || ((ZVar8 == Z80_MEM_IY || (ZVar8 == Z80_MEM_IX)))) {
LAB_00136d90:
      ZVar10 = (uint)ZVar8 >> 8;
      ZVar14 = ZVar8 & 0xff;
      goto LAB_00136da9;
    }
switchD_00136df7_caseD_a:
    in_RSI = 1;
    EmitBytes(&local_68,true);
    in_RDI = &lp;
    cVar5 = (*DAT_0018e520)();
    if (cVar5 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LD() {
		aint b;
		EBracketType bt;
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 }, pemaRes;
			Z80Reg reg2 = Z80_UNK, reg1 = GetRegister(lp);
			// resolve all register to register cases or fixed memory literals
			// "(hl)|(ixy+d)|(hl+)|(hl-)" (but not other memory or constant)
			if (Z80_UNK != reg1 && LD_simple_r_r(e, reg1)) {
				EmitBytes(e, true);
				continue;
			}
			// memory, constant, fake instruction or syntax error is involved
			// (!!! comma is already parsed for all destination=register cases)
			switch (reg1) {
			case Z80_A:
				if (BT_NONE != (bt = OpenBracket(lp))) {
					reg2 = GetRegister(lp);
					if ((Z80_BC == reg2 || Z80_DE == reg2) && CloseBracket(lp)) e[0] = reg2-6;
					else if (Z80_C == reg2 && Options::IsLR35902 && CloseBracket(lp)) {
						e[0] = 0xF2;	// Sharp LR35902 `ld a,(c)` (targetting [$ff00+c])
					}
					if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
					// give non-register another chance to parse as value expression
					--lp;
				}
				switch (ParseExpressionMemAccess(lp, b)) {
					// LD a,imm8
					case 1:
						check8(b); e[0] = 0x06 + 8*reg1; e[1] = b & 255;
						resolveRelocationAndSmartSmc(1, Relocation::HIGH);
						break;
					// LD a,(mem8)
					case 2:
						check16(b);
						if (Options::IsLR35902) {
							if (0xFF00 <= b && b <= 0xFFFF) {
								e[0] = 0xF0; e[1] = b & 255;
							} else {
								e[0] = 0xFA; e[1] = b & 255; e[2] = (b >> 8) & 255;
								resolveRelocationAndSmartSmc(1);
							}
							break;
						}
						e[0] = 0x3a; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						if (BT_ROUND == bt) checkLowMemory(e[2], e[1]);
						break;
				}
				break;

			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				e[0] = 0x06 + 8*reg1; e[1] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(1, Relocation::HIGH);
				break;

			case Z80_MEM_HL:
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE:	// fake ld (hl),bc|de
					if (Options::noFakes()) break;
					e[0] = 0x70 + GetRegister_r16Low(reg2);		e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;								e[3] = INSTRUCTION_START_MARKER;
					e[4] = 0x70 + GetRegister_r16High(reg2);	e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_UNK:	// ld (hl),n
					e[0] = 0x36; e[1] = GetByteNoMem(lp);
					resolveRelocationAndSmartSmc(1, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_MEM_IX: case Z80_MEM_IY:
				e[2] = GetRegister_lastIxyD;
				switch (reg2 = GetRegister(lp)) {
				case Z80_BC: case Z80_DE: case Z80_HL:
					if (Options::noFakes()) break;		//fake LD (ixy+#),r16
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = reg1&0xFF;
					e[1] = 0x70+GetRegister_r16Low(reg2);
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1&0xFF;
					e[5] = 0x70+GetRegister_r16High(reg2);
					e[6] = e[2] + 1;
					break;
				case Z80_UNK:
					e[0] = reg1&0xFF; e[1] = 0x36; e[3] = GetByteNoMem(lp);	// LD (ixy+#),imm8
					resolveRelocationAndSmartSmc(3, Relocation::HIGH);
					break;
				default:
					break;
				}
				break;

			case Z80_IXH: case Z80_IXL: case Z80_IYH: case Z80_IYL:
				e[0] = reg1&0xFF; e[1] = 0x06 + 8*(reg1>>8); e[2] = GetByteNoMem(lp);
				resolveRelocationAndSmartSmc(2, Relocation::HIGH);
				break;

			case Z80_BC: case Z80_DE: case Z80_HL: case Z80_SP:
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:	// invalid combinations filtered already by LD_simple_r_r
					if (Options::noFakes()) break;	// fake ld bc|de,(hl)
					e[0] = reg1+0x3e;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					e[3] = INSTRUCTION_START_MARKER;
					e[4] = reg1+0x36;
					e[5] = INSTRUCTION_START_MARKER;
					e[6] = 0x2b;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:	// invalid combinations NOT filtered -> validate
					if (Z80_SP == reg1 || Options::noFakes()) break;	// fake bc|de|hl,(ix+#)
					e[1] = reg1+0x3e;
					e[5] = reg1+0x36;
					e[2] = GetRegister_lastIxyD;
					e[6] = e[2]+1;
					if (e[2] == 127) Error("Offset out of range", nullptr, IF_FIRST);
					else e[0] = e[4] = reg2&0xFF;
					e[3] = INSTRUCTION_START_MARKER;
					break;
				case Z80_SP:
					if (Options::IsLR35902 && Z80_HL == reg1) {		// "ld hl,sp+r8" syntax = "F8 r8"
						b = 0;
						// "sp" must be followed by + or - (or nothing: "ld hl,sp" = +0)
						if (!SkipBlanks(lp) && ',' != *lp ) {		// comma is probably multi-arg
							if ('+' != *lp && '-' != *lp) {
								Error("[LD] `ld hl,sp+r8` expects + or - after sp, found", lp);
								break;
							}
							b = GetByteNoMem(lp, true);
						}
						e[0] = 0xF8;
						e[1] = b;
					}
					break;
				default:
					break;
				}
				if (Z80_UNK != reg2) break;	//"(register": emit instruction || bug
				switch (ParseExpressionMemAccess(lp, b)) {
					// ld bc|de|hl|sp,imm16
					case 1: check16(b); e[0] = reg1-0x0F; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					// LD r16,(mem16)
					case 2:
						if (Options::IsLR35902) break;	// no "ld r16,(a16)" instruction on LR35902
						check16(b);
						if (Z80_HL == reg1) {		// ld hl,(mem16)
							e[0] = 0x2a; e[1] = b & 255; e[2] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(1);
						} else {					// ld bc|de|sp,(mem16)
							if (Options::IsI8080) break;
							e[0] = 0xed; e[1] = reg1+0x3b; e[2] = b & 255; e[3] = (b >> 8) & 255;
							resolveRelocationAndSmartSmc(2);
						}
						if (')' == lp[-1]) checkLowMemory(b>>8, b);
				}
				break;

			case Z80_IX:
			case Z80_IY:
				if (0 < (pemaRes = ParseExpressionMemAccess(lp, b))) {
					e[0] = reg1; e[1] = (1 == pemaRes) ? 0x21 : 0x2a;	// ld ix|iy,imm16  ||  ld ix|iy,(mem16)
					check16(b); e[2] = b & 255; e[3] = (b >> 8) & 255;
					resolveRelocationAndSmartSmc(2);
					if ((2 == pemaRes) && ')' == lp[-1]) checkLowMemory(e[3], e[2]);
				}
				break;

			case Z80_UNK:
				if (BT_NONE == OpenBracket(lp)) break;
				reg1 = GetRegister(lp);
				if (Z80_UNK == reg1) b = GetWord(lp);
				if (!CloseBracket(lp) || !comma(lp)) break;
				reg2 = GetRegister(lp);
				switch (reg1) {
				case Z80_C:
					if (Options::IsLR35902 && Z80_A == reg2) {	// Sharp LR35902 `ld (c),a` (targetting [$ff00+c])
						e[0] = 0xE2;
					}
					break;
				case Z80_BC:
				case Z80_DE:
					if (Z80_A == reg2) e[0] = reg1-14;	// LD (bc|de),a
					break;
				case Z80_UNK:
					if (Options::IsLR35902) {	// Sharp LR35902 has quite different opcodes for these
						LD_LR35902(e, reg2, b);
						break;
					}
					// Standard Z80 and i8080 opcodes for ld (nn),reg
					switch (reg2) {
					case Z80_A:		// LD (nnnn),a|hl
					case Z80_HL:
						e[0] = (Z80_A == reg2) ? 0x32 : 0x22; e[1] = b & 255; e[2] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(1);
						break;
					case Z80_BC:	// LD (nnnn),bc|de|sp
					case Z80_DE:
					case Z80_SP:
						if (Options::IsI8080) break;
						e[0] = 0xed; e[1] = 0x33+reg2; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					case Z80_IX:	// LD (nnnn),ix|iy
					case Z80_IY:
						e[0] = reg2; e[1] = 0x22; e[2] = b & 255; e[3] = (b >> 8) & 255;
						resolveRelocationAndSmartSmc(2);
						break;
					default:
						break;
					}
					break;
				default:
					break;
				}
				break;
			default:
				break;
			}
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}